

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O3

float ssd(qnode_ptr_t f,qnode_ptr_t g,int x1,int y1,int x2,int y2)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  
  iVar6 = kera.m / 2;
  iVar2 = -iVar6;
  fVar13 = 0.0;
  if (iVar2 == iVar6 || SBORROW4(iVar2,iVar6) != iVar6 * -2 < 0) {
    lVar11 = (long)iVar2;
    lVar1 = lVar11 + iVar6;
    lVar8 = y2 + lVar11;
    lVar7 = y1 + lVar11;
    do {
      lVar3 = lVar11 + x1;
      iVar5 = 0;
      if (-1 < lVar3) {
        iVar5 = (int)lVar3;
        if (f->sizy <= lVar3) {
          iVar5 = f->sizy + -1;
        }
      }
      lVar3 = lVar11 + x2;
      if (lVar3 < 0) {
        iVar9 = 0;
      }
      else {
        iVar9 = (int)lVar3;
        if (g->sizy <= lVar3) {
          iVar9 = g->sizy + -1;
        }
      }
      lVar3 = 0;
      do {
        lVar4 = lVar7 + lVar3;
        iVar10 = 0;
        if (-1 < lVar4) {
          iVar10 = y1 + iVar2 + (int)lVar3;
          if (f->sizx <= lVar4) {
            iVar10 = f->sizx + -1;
          }
        }
        lVar4 = lVar8 + lVar3;
        iVar12 = 0;
        if (-1 < lVar4) {
          iVar12 = y2 + iVar2 + (int)lVar3;
          if (g->sizx <= lVar4) {
            iVar12 = g->sizx + -1;
          }
        }
        fVar14 = (*f->lap_ptr)[iVar10 + iVar5 * f->res] - (*g->lap_ptr)[iVar12 + iVar9 * g->res];
        fVar13 = fVar14 * fVar14 * kera.k[lVar3 + lVar1] * kera.k[iVar6 + lVar11] + fVar13;
        lVar3 = lVar3 + 1;
      } while (iVar6 + 1 + iVar6 != (int)lVar3);
      lVar11 = lVar11 + 1;
    } while (iVar6 + 1 != (int)lVar11);
  }
  return fVar13 / (kera.f * kera.f);
}

Assistant:

float ssd(f,g,x1,y1,x2,y2)
qnode_ptr_t f, g ;
int x1, y1, x2, y2 ;

{ extern kernel_t kera ;
  int k1, k2, xr1, yr1, xr2, yr2 ;
  float s ;

  s = 0.0 ;
  for (k1 = -kera.m/2 ; k1 <= kera.m/2; k1++) {
    if (x1 + k1 < 0) {
      xr1 = 0 ;
    }
    else {
      if (x1 + k1 >= f->sizy) {
        xr1 = f->sizy - 1 ;
      }
      else {
        xr1 = x1 + k1 ;
      }
    }
    if (x2 + k1 < 0) {
      xr2 = 0 ;
    }
    else {
      if (x2 + k1 >= g->sizy) {
        xr2 = g->sizy - 1 ;
      }
      else {
        xr2 = x2 + k1 ;
      }
    }
    for (k2 = -kera.m/2 ; k2 <= kera.m/2 ; k2++) {
      if (y1 + k2 < 0) {
        yr1 = 0 ;
      }
      else {
        if (y1 + k2 >= f->sizx) {
          yr1 = f->sizx - 1 ;
        }
        else {
          yr1 = y1 + k2 ;
        }
      }
      if (y2 + k2 < 0) {
        yr2 = 0 ;
      }
      else {
        if (y2 + k2 >= g->sizx) {
          yr2 = g->sizx - 1 ;
        }
        else {
          yr2 = y2 + k2 ;
        }
      }
      s = s + (float)kera.k[k1+kera.m/2]*(float)kera.k[k2+kera.m/2]*
      pow(((*f->lap_ptr)[f->res*xr1 + yr1] -
           (*g->lap_ptr)[g->res*xr2 + yr2]),2.0) ;
    }
  }
  return(s/(kera.f*kera.f)) ;
}